

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicorn_arm.c
# Opt level: O2

_Bool arm_stop_interrupt(uc_struct_conflict *uc,int intno)

{
  if (intno != 0x10004) {
    if (intno == 0x12) {
      uc->invalid_error = 0x15;
    }
    else if (intno != 1) {
      return false;
    }
  }
  return true;
}

Assistant:

static bool arm_stop_interrupt(struct uc_struct *uc, int intno)
{
    switch (intno) {
    default:
        return false;
    case EXCP_UDEF:
    case EXCP_YIELD:
        return true;
    case EXCP_INVSTATE:
        uc->invalid_error = UC_ERR_EXCEPTION;
        return true;
    }
}